

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::fromUtf8(QString *__return_storage_ptr__,QString *this,QByteArrayView ba)

{
  long in_FS_OFFSET;
  QByteArrayView in;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  in.m_data = (storage_type *)ba.m_size;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (in.m_data == (storage_type *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0011cbb2;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (this == (QString *)0x0) {
    local_28.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_28.size = 0;
    (__return_storage_ptr__->d).ptr = L"";
    (__return_storage_ptr__->d).size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0011cbb2;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_0011cbb2:
      __stack_chk_fail();
    }
    in.m_size = (qsizetype)this;
    QUtf8::convertToUnicode(__return_storage_ptr__,in);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::fromUtf8(QByteArrayView ba)
{
    if (ba.isNull())
        return QString();
    if (ba.isEmpty())
        return QString(DataPointer::fromRawData(&_empty, 0));
    return QUtf8::convertToUnicode(ba);
}